

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O0

int update_lib_bindings(Elf64_Sym *symbol,char *name,Elf64_Addr offset,link_map *lmap,
                       hash_table_t *lookuptable)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  char *local_a0;
  char *local_98;
  char *local_78;
  void **got_address;
  internal_binding_t *internal_binding;
  hash_table_t *phStack_40;
  int result;
  hash_table_t *lookuptable_local;
  link_map *lmap_local;
  Elf64_Addr offset_local;
  char *name_local;
  Elf64_Sym *symbol_local;
  
  internal_binding._4_4_ = 0;
  got_address = (void **)0x0;
  phStack_40 = lookuptable;
  lookuptable_local = (hash_table_t *)lmap;
  lmap_local = (link_map *)offset;
  offset_local = (Elf64_Addr)name;
  name_local = (char *)symbol;
  internal_binding._4_4_ = lookup_hashtable(lookuptable,name,&got_address);
  if (internal_binding._4_4_ == 0) {
    writeAddress((void *)((long)&lmap_local->l_addr + lookuptable_local->table_size),
                 *(void **)((long)got_address[1] + 8));
    __stream = _stderr;
    if (2 < debug_level) {
      uVar1 = gotcha_gettid();
      uVar2 = getpid();
      local_78 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                         ,0x2f);
      if (local_78 == (char *)0x0) {
        local_78 = "";
      }
      if (lookuptable_local->entry_count == 0) {
        local_98 = "[NULL]";
      }
      else {
        if (*(char *)lookuptable_local->entry_count == '\0') {
          local_a0 = "[EMPTY]";
        }
        else {
          local_a0 = (char *)lookuptable_local->entry_count;
        }
        local_98 = local_a0;
      }
      fprintf(__stream,"[%d/%d][%s:%u] - Remapped call to %s at 0x%lx in %s to wrapper at 0x%p\n",
              (ulong)uVar1,(ulong)uVar2,local_78 + 1,0xde,offset_local,
              (long)&lmap_local->l_addr + lookuptable_local->table_size,local_98,
              *(undefined8 *)((long)got_address[1] + 8));
    }
    symbol_local._4_4_ = 0;
  }
  else {
    symbol_local._4_4_ = -1;
  }
  return symbol_local._4_4_;
}

Assistant:

static int update_lib_bindings(ElfW(Sym) * symbol KNOWN_UNUSED, char *name,
                               ElfW(Addr) offset, struct link_map *lmap,
                               hash_table_t *lookuptable) {
  int result = 0;
  struct internal_binding_t *internal_binding = NULL;
  void **got_address = NULL;

  result = lookup_hashtable(lookuptable, name, (void **)&internal_binding);
  if (result != 0) return -1;
  got_address = (void **)(lmap->l_addr + offset);
  writeAddress(got_address, internal_binding->user_binding->wrapper_pointer);
  debug_printf(3, "Remapped call to %s at 0x%lx in %s to wrapper at 0x%p\n",
               name, (lmap->l_addr + offset), LIB_NAME(lmap),
               internal_binding->user_binding->wrapper_pointer);
  return 0;
}